

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_stricmpn(char *s1,char *s2,int n)

{
  char cVar1;
  long lVar2;
  int iVar3;
  
  if (n < 0) {
    __assert_fail("n >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x195a,"int nk_stricmpn(const char *, const char *, int)");
  }
  lVar2 = 0;
  while( true ) {
    if (n == (int)lVar2) {
      return 0;
    }
    cVar1 = s1[lVar2];
    iVar3 = (int)cVar1 - (int)s2[lVar2];
    if (((iVar3 != 0) && ((0x19 < (byte)(cVar1 + 0xbfU) || (iVar3 = iVar3 + 0x20, iVar3 != 0)))) &&
       ((0x19 < (byte)(s2[lVar2] + 0xbfU) || (iVar3 = iVar3 + -0x20, iVar3 != 0)))) break;
    lVar2 = lVar2 + 1;
    if (cVar1 == '\0') {
      return 0;
    }
  }
  return iVar3 >> 0x1f | 1;
}

Assistant:

NK_API int
nk_stricmpn(const char *s1, const char *s2, int n)
{
    int c1,c2,d;
    NK_ASSERT(n >= 0);
    do {
        c1 = *s1++;
        c2 = *s2++;
        if (!n--) return 0;

        d = c1 - c2;
        while (d) {
            if (c1 <= 'Z' && c1 >= 'A') {
                d += ('a' - 'A');
                if (!d) break;
            }
            if (c2 <= 'Z' && c2 >= 'A') {
                d -= ('a' - 'A');
                if (!d) break;
            }
            return ((d >= 0) << 1) - 1;
        }
    } while (c1);
    return 0;
}